

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash.cpp
# Opt level: O0

OptError * multihash::decode(OptError *__return_storage_ptr__,string *str,Multihash *m)

{
  Multihash *in_RCX;
  undefined1 local_38 [8];
  Bytes buf;
  Multihash *m_local;
  string *str_local;
  
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)m;
  binary::decodeHex((Bytes *)local_38,str);
  decode_abi_cxx11_(__return_storage_ptr__,(multihash *)local_38,
                    (Bytes *)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,in_RCX);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

OptError decode(std::string str, Multihash &m) {
	Bytes buf = binary::decodeHex(str);
	return decode(buf, m);
}